

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

StructBuilder * __thiscall
capnp::_::OrphanBuilder::asStruct
          (StructBuilder *__return_storage_ptr__,OrphanBuilder *this,StructSize size)

{
  word *refTarget;
  SegmentBuilder *segment;
  CapTableBuilder *capTable;
  bool bVar1;
  WirePointer *pWVar2;
  BuilderArena *orphanArena;
  Fault local_20;
  Fault f;
  OrphanBuilder *this_local;
  StructSize size_local;
  
  f.exception = (Exception *)this;
  pWVar2 = tagAsPtr(this);
  bVar1 = WirePointer::isNull(pWVar2);
  if (bVar1 == (this->location == (word *)0x0)) {
    pWVar2 = tagAsPtr(this);
    refTarget = this->location;
    segment = this->segment;
    capTable = this->capTable;
    orphanArena = SegmentBuilder::getArena(this->segment);
    WireHelpers::getWritableStructPointer
              (__return_storage_ptr__,pWVar2,refTarget,segment,capTable,size,(word *)0x0,orphanArena
              );
    this->location = (word *)__return_storage_ptr__->data;
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0xdca,FAILED,"tagAsPtr()->isNull() == (location == nullptr)","");
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

StructBuilder OrphanBuilder::asStruct(StructSize size) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  StructBuilder result = WireHelpers::getWritableStructPointer(
      tagAsPtr(), location, segment, capTable, size, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = reinterpret_cast<word*>(result.data);

  return result;
}